

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMPointsToSet.h
# Opt level: O0

void __thiscall dg::DGLLVMPointsToSet::DGLLVMPointsToSet(DGLLVMPointsToSet *this,PointsToSetT *S)

{
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&> *in_RSI;
  PointerIdPointsToSet *in_RDI;
  
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::LLVMPointsToSetImplTemplate
            (in_RSI,in_RDI);
  (in_RDI->pointers)._bits.
  super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  .
  super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ._M_h._M_buckets = (__buckets_ptr)&PTR_hasUnknown_001fd608;
  LLVMPointsToSetImplTemplate<const_dg::pta::PointerIdPointsToSet_&>::initialize_iterator(in_RSI);
  return;
}

Assistant:

DGLLVMPointsToSet(const PointsToSetT &S) : LLVMPointsToSetImplTemplate(S) {
        initialize_iterator();
    }